

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O2

void ConstructionHeuristics::assignGivenDay(Solution *solution,uint dayIndex,string *skillId)

{
  Turn *this;
  bool bVar1;
  int iVar2;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *this_00;
  const_reference pvVar3;
  string *psVar4;
  Scenario *this_01;
  WeekData *this_02;
  ShiftType *this_03;
  string *shift;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  _Base_ptr p_Var6;
  pointer ppTVar7;
  uint local_44;
  string *local_40;
  pointer local_38;
  
  local_40 = skillId;
  this_00 = Solution::getTurns(solution);
  pvVar3 = std::
           vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ::at(this_00,(ulong)dayIndex);
  ppTVar7 = (pvVar3->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (pvVar3->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (ppTVar7 == local_38) {
      return;
    }
    this = *ppTVar7;
    if (local_40->_M_string_length == 0) {
LAB_00115853:
      this_01 = Scenario::getInstance();
      this_02 = Scenario::getWeekData(this_01);
      psVar4 = Turn::getSkill_abi_cxx11_(this);
      this_03 = Turn::getShiftType(this);
      shift = ShiftType::getId_abi_cxx11_(this_03);
      local_44 = dayIndex;
      iVar2 = WeekData::getMinimumCoverageRequirement(this_02,psVar4,shift,(int *)&local_44);
      if (iVar2 != 0) {
        pmVar5 = Solution::getNurses_abi_cxx11_(solution);
        for (p_Var6 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          bVar1 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(p_Var6 + 2),this);
          if (bVar1) {
            if (iVar2 < 2) break;
            iVar2 = iVar2 + -1;
          }
        }
      }
    }
    else {
      psVar4 = Turn::getSkill_abi_cxx11_(this);
      bVar1 = std::operator!=(psVar4,local_40);
      if (!bVar1) goto LAB_00115853;
    }
    ppTVar7 = ppTVar7 + 1;
  } while( true );
}

Assistant:

void ConstructionHeuristics::assignGivenDay(Solution *solution, unsigned int dayIndex, const string &skillId) {
    int minimum;
    for (Turn *turn : solution->getTurns().at(dayIndex)) {
        if (!skillId.empty() && turn->getSkill() != skillId)
            continue;

        minimum = Scenario::getInstance()->getWeekData().getMinimumCoverageRequirement(turn->getSkill(),
                                                                                       turn->getShiftType()->getId(),
                                                                                       dayIndex);
        if (minimum == 0)
            continue;

        for (auto const &it : solution->getNurses())
            if (solution->assignNurseToTurn(it.second, turn))
                if (--minimum <= 0)
                    break;
    }
}